

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O0

void bench_group_add_var(void *arg,int iters)

{
  int in_ESI;
  bench_inv *data;
  int i;
  secp256k1_fe *in_stack_00000198;
  secp256k1_gej *in_stack_000001a0;
  secp256k1_gej *in_stack_000001a8;
  secp256k1_gej *in_stack_000001b0;
  undefined4 local_10;
  
  for (local_10 = 0; local_10 < in_ESI; local_10 = local_10 + 1) {
    secp256k1_gej_add_var(in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,in_stack_00000198);
  }
  return;
}

Assistant:

static void bench_group_add_var(void* arg, int iters) {
    int i;
    bench_inv *data = (bench_inv*)arg;

    for (i = 0; i < iters; i++) {
        secp256k1_gej_add_var(&data->gej[0], &data->gej[0], &data->gej[1], NULL);
    }
}